

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_comp_avg_pred_c(uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,
                        int ref_stride)

{
  ulong uVar1;
  int iVar2;
  
  if (0 < height) {
    iVar2 = 0;
    do {
      if (0 < width) {
        uVar1 = 0;
        do {
          comp_pred[uVar1] = (uint8_t)((uint)pred[uVar1] + (uint)ref[uVar1] + 1 >> 1);
          uVar1 = uVar1 + 1;
        } while ((uint)width != uVar1);
      }
      comp_pred = comp_pred + width;
      pred = pred + width;
      ref = ref + ref_stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 != height);
  }
  return;
}

Assistant:

void aom_comp_avg_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                         int height, const uint8_t *ref, int ref_stride) {
  int i, j;

  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}